

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardFile.cpp
# Opt level: O3

bool __thiscall Diligent::StandardFile::Read(StandardFile *this,IDataBlob *pData)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char (*in_RCX) [17];
  string msg;
  string local_38;
  
  if (pData == (IDataBlob *)0x0) {
    FormatString<char[26],char[17]>
              (&local_38,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x369cde,in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"Read",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Basic/src/StandardFile.cpp"
               ,0x3d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  sVar4 = GetSize(this);
  (*(pData->super_IObject)._vptr_IObject[4])(pData,sVar4);
  iVar2 = (*(pData->super_IObject)._vptr_IObject[6])(pData,0);
  iVar3 = (*(pData->super_IObject)._vptr_IObject[5])(pData);
  bVar1 = Read(this,(void *)CONCAT44(extraout_var,iVar2),CONCAT44(extraout_var_00,iVar3));
  return bVar1;
}

Assistant:

bool StandardFile::Read(IDataBlob* pData)
{
    VERIFY_EXPR(pData != nullptr);
    auto FileSize = GetSize();
    pData->Resize(FileSize);
    return Read(pData->GetDataPtr(), pData->GetSize());
}